

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqpvalue.c
# Opt level: O3

int encode_symbol_value(AMQPVALUE_ENCODER_OUTPUT encoder_output,void *context,char *value,
                       size_t length,_Bool use_smallest)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  int iVar3;
  undefined7 in_register_00000081;
  char *pcVar4;
  uchar local_25;
  uchar local_24;
  uchar local_23;
  uchar local_22;
  uchar local_21;
  
  if ((int)CONCAT71(in_register_00000081,use_smallest) == 0) {
    iVar1 = (*encoder_output)(context,&local_23,1);
    if ((((iVar1 == 0) && (iVar1 = (*encoder_output)(context,&local_22,1), iVar1 == 0)) &&
        (iVar1 = (*encoder_output)(context,&local_25,1), iVar1 == 0)) &&
       ((iVar1 = (*encoder_output)(context,&local_21,1), iVar1 == 0 &&
        (iVar1 = (*encoder_output)(context,(uchar *)value,length), iVar1 == 0)))) {
      return 0;
    }
    p_Var2 = xlogging_get_log_function();
    iVar1 = 0xe54;
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return 0xe54;
    }
    pcVar4 = "Failed encoding large symbol value";
    iVar3 = 0xe53;
  }
  else {
    iVar1 = (*encoder_output)(context,&local_24,1);
    if ((iVar1 == 0) && (iVar1 = (*encoder_output)(context,(uchar *)value,length), iVar1 == 0)) {
      return 0;
    }
    p_Var2 = xlogging_get_log_function();
    iVar1 = 0xe40;
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return 0xe40;
    }
    pcVar4 = "Failed encoding small symbol value";
    iVar3 = 0xe3f;
  }
  (*p_Var2)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqpvalue.c"
            ,"encode_symbol_value",iVar3,1,pcVar4);
  return iVar1;
}

Assistant:

static int encode_symbol_value(AMQPVALUE_ENCODER_OUTPUT encoder_output, void* context, const char* value, size_t length, bool use_smallest)
{
    int result;

    if (use_smallest)
    {
        /* Codes_SRS_AMQPVALUE_01_301: [<encoding name="sym8" code="0xa3" category="variable" width="1" label="up to 2^8 - 1 seven bit ASCII characters representing a symbolic value"/>] */
        if ((output_byte(encoder_output, context, (unsigned char)length) != 0) ||
            (output_bytes(encoder_output, context, value, length) != 0))
        {
            /* Codes_SRS_AMQPVALUE_01_274: [When the encoder output function fails, amqpvalue_encode shall fail and return a non-zero value.] */
            LogError("Failed encoding small symbol value");
            result = MU_FAILURE;
        }
        else
        {
            /* Codes_SRS_AMQPVALUE_01_266: [On success amqpvalue_encode shall return 0.] */
            result = 0;
        }
    }
    else
    {
        /* Codes_SRS_AMQPVALUE_01_302: [<encoding name="sym32" code="0xb3" category="variable" width="4" label="up to 2^32 - 1 seven bit ASCII characters representing a symbolic value"/>] */
        if ((output_byte(encoder_output, context, (length >> 24) & 0xFF) != 0) ||
            (output_byte(encoder_output, context, (length >> 16) & 0xFF) != 0) ||
            (output_byte(encoder_output, context, (length >> 8) & 0xFF) != 0) ||
            (output_byte(encoder_output, context, length & 0xFF) != 0) ||
            /* Codes_SRS_AMQPVALUE_01_122: [Symbols are encoded as ASCII characters [ASCII].] */
            (output_bytes(encoder_output, context, value, length) != 0))
        {
            /* Codes_SRS_AMQPVALUE_01_274: [When the encoder output function fails, amqpvalue_encode shall fail and return a non-zero value.] */
            LogError("Failed encoding large symbol value");
            result = MU_FAILURE;
        }
        else
        {
            /* Codes_SRS_AMQPVALUE_01_266: [On success amqpvalue_encode shall return 0.] */
            result = 0;
        }
    }

    return result;
}